

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::add_a_d8(CPU *this)

{
  IMmu *pIVar1;
  Registers *r1;
  int iVar2;
  
  pIVar1 = this->mmu;
  r1 = this->regs;
  r1->pc = r1->pc + 1;
  iVar2 = (**pIVar1->_vptr_IMmu)();
  add_r8_r8(this,&r1->a,(uint8_t)iVar2);
  return 2;
}

Assistant:

int CPU::add_a_d8() {
    add_r8_r8(regs.a, mmu.read_byte(regs.pc++));
    return 2;
}